

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O0

int lws_spa_process(lws_spa *spa,char *in,int len)

{
  int len_local;
  char *in_local;
  lws_spa *spa_local;
  
  if (spa == (lws_spa *)0x0) {
    _lws_log(1,"%s: NULL spa\n","lws_spa_process");
    spa_local._4_4_ = -1;
  }
  else if (spa->finalized == '\0') {
    spa_local._4_4_ = lws_urldecode_s_process(spa->s,in,len);
  }
  else {
    spa_local._4_4_ = 0;
  }
  return spa_local._4_4_;
}

Assistant:

int
lws_spa_process(struct lws_spa *spa, const char *in, int len)
{
	if (!spa) {
		lwsl_err("%s: NULL spa\n", __func__);
		return -1;
	}
	/* we reject any junk after the last part arrived and we finalized */
	if (spa->finalized)
		return 0;

	return lws_urldecode_s_process(spa->s, in, len);
}